

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdFetchMoffset(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                       ND_UINT8 MoffsetSize)

{
  NDSTATUS NVar1;
  ND_UINT64 NVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  undefined3 in_register_00000081;
  byte bVar4;
  
  uVar3 = CONCAT71(in_register_00000011,Offset) & 0xffffffff;
  NVar1 = 0x80000001;
  if (CONCAT31(in_register_00000081,MoffsetSize) + uVar3 <= Size) {
    Instrux->field_0x7 = Instrux->field_0x7 | 1;
    *(ulong *)&Instrux->field_0xc =
         (ulong)((uint)CONCAT71(in_register_00000011,Offset) & 0xf) << 0x38 |
         (ulong)((MoffsetSize & 0xf) << 0x18) | *(ulong *)&Instrux->field_0xc & 0xf0fffffff0ffffff;
    NVar2 = NdFetchData(Code + uVar3,MoffsetSize);
    (Instrux->field_74).Moffset = NVar2;
    bVar4 = MoffsetSize + Instrux->Length;
    Instrux->Length = bVar4;
    NVar1 = 0x80000003;
    if (bVar4 < 0x10) {
      NVar1 = 0;
    }
  }
  return NVar1;
}

Assistant:

static NDSTATUS
NdFetchMoffset(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 MoffsetSize
    )
{
    RET_GT((ND_SIZET)Offset + MoffsetSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasMoffset = ND_TRUE;
    Instrux->MoffsetLength = MoffsetSize;
    Instrux->MoffsetOffset = Offset;

    Instrux->Moffset = NdFetchData(Code + Offset, MoffsetSize);

    Instrux->Length += MoffsetSize;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}